

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

int __thiscall
gmath::OrthoCamera::clone
          (OrthoCamera *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  OrthoCamera *ret;
  OrthoCamera *in_stack_ffffffffffffffc8;
  
  pvVar1 = operator_new(0xd0);
  OrthoCamera(this);
  operator=(this,in_stack_ffffffffffffffc8);
  return (int)pvVar1;
}

Assistant:

Camera *OrthoCamera::clone() const
{
  OrthoCamera *ret=new OrthoCamera();

  *ret=*this;

  return ret;
}